

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat * __thiscall Mat::dot(Mat *this,Mat *a)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong *puVar7;
  long lVar8;
  reference pvVar9;
  long in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int i;
  int l;
  Mat *ret;
  undefined8 in_stack_ffffffffffffffa8;
  Mat *pMVar10;
  int local_24;
  
  pMVar10 = in_RDI;
  Mat(in_RDI,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8);
  iVar1 = in_RSI->r;
  iVar2 = in_RSI->c;
  for (local_24 = 0; local_24 < iVar1 * iVar2; local_24 = local_24 + 1) {
    puVar7 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                (&in_RSI->val,(long)local_24);
    uVar3 = *puVar7;
    uVar4 = puVar7[1];
    puVar7 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                ((vector<__int128,_std::allocator<__int128>_> *)(in_RDX + 0x10),
                                 (long)local_24);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar3;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *puVar7;
    lVar8 = SUB168(auVar5 * auVar6,8) + uVar3 * puVar7[1] + uVar4 * *puVar7;
    pvVar9 = std::vector<__int128,_std::allocator<__int128>_>::operator[]
                       (&pMVar10->val,(long)local_24);
    *(long *)pvVar9 = SUB168(auVar5 * auVar6,0);
    *(long *)((long)pvVar9 + 8) = lVar8;
  }
  residual(in_RSI);
  return in_RDI;
}

Assistant:

Mat Mat::dot(const Mat &a) {
    Mat ret(r, c);
    int l = r * c;
    for (int i = 0; i < l; i++) {
        ret.val[i] = val[i] * a.val[i];
    }
    ret.residual();
    return ret;
}